

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool CheckBlock(CBlock *block,BlockValidationState *state,Params *consensusParams,bool fCheckPOW,
               bool fCheckMerkleRoot)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer psVar7;
  undefined3 in_register_00000081;
  undefined4 uVar8;
  undefined4 in_register_00000084;
  int iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar11;
  long in_FS_OFFSET;
  TxValidationState tx_state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  uVar8 = CONCAT31(in_register_00000081,fCheckMerkleRoot);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = 1;
  if (block->fChecked != false) goto LAB_003febc1;
  bVar1 = CheckBlockHeader(&block->super_CBlockHeader,state,consensusParams,fCheckPOW);
  if (!bVar1) {
LAB_003fe78c:
    bVar2 = 0;
    goto LAB_003febc1;
  }
  if (((consensusParams->signet_blocks & fCheckPOW) == 1) &&
     (bVar1 = CheckSignetBlockSolution(block,consensusParams), !bVar1)) {
    local_a0._0_8_ = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"bad-signet-blksig","");
    local_58._M_allocated_capacity = (size_type)&local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"signet block signature validation failure","");
    bVar2 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                       (string *)local_a0,(string *)&local_58);
    goto LAB_003feb88;
  }
  if ((fCheckMerkleRoot) && (bVar1 = CheckMerkleRoot(block,state), !bVar1)) goto LAB_003fe78c;
  psVar11 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar7 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)psVar11 - (long)psVar7) < 0xf42401 && psVar11 != psVar7) {
    local_a0._0_8_ = &TX_NO_WITNESS;
    paVar6 = &local_58;
    local_58._M_allocated_capacity = (size_type)&DAT_00000050;
    local_a0._8_8_ = paVar6;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_c0,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_a0,&block->vtx);
    if (&LAB_003d0900 < (undefined1 *)(local_58._M_allocated_capacity << 2)) goto LAB_003fe721;
    psVar11 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((psVar11 !=
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar1 = CTransaction::IsCoinBase
                          ((psVar11->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr), bVar1)) {
      psVar11 = (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar7 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (0x10 < (ulong)((long)psVar7 - (long)psVar11)) {
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x2;
        do {
          bVar1 = CTransaction::IsCoinBase
                            (psVar11[(long)paVar5].
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (bVar1) {
            local_a0._0_8_ = local_90;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"bad-cb-multiple","")
            ;
            local_58._M_allocated_capacity = (size_type)&local_48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"more than one coinbase","");
            bVar2 = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                               (string *)local_a0,(string *)&local_58);
            goto LAB_003feb88;
          }
          psVar11 = (block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar7 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(ulong)((int)paVar10 + 1);
          bVar1 = paVar10 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)psVar7 - (long)psVar11 >> 4);
          paVar5 = paVar10;
          paVar10 = paVar6;
        } while (bVar1);
      }
      if (psVar11 != psVar7) {
        do {
          local_a0._0_8_ = (TransactionSerParams *)0x0;
          local_a0._8_8_ = local_90 + 8;
          local_90._0_8_ = 0;
          local_90[8] = '\0';
          local_78._M_p = (pointer)&local_68;
          local_70 = 0;
          local_68._M_local_buf[0] = '\0';
          bVar1 = CheckTransaction((psVar11->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr,(TxValidationState *)local_a0);
          if (!bVar1) {
            if (local_a0._4_4_ != TX_CONSENSUS) {
              __assert_fail("tx_state.GetResult() == TxValidationResult::TX_CONSENSUS",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0xfcd,
                            "bool CheckBlock(const CBlock &, BlockValidationState &, const Consensus::Params &, bool, bool)"
                           );
            }
            local_58._M_allocated_capacity = (size_type)&local_48;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,local_a0._8_8_,(char *)(local_a0._8_8_ + local_90._0_8_))
            ;
            base_blob<256u>::ToString_abi_cxx11_
                      (&local_e0,
                       &((psVar11->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->hash);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,local_78._M_p,local_78._M_p + local_70);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_c0,(tinyformat *)"Transaction check failed (tx hash %s) %s",
                       (char *)&local_e0,&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_register_00000084,uVar8));
            bVar3 = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                               (string *)&local_58,&local_c0);
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(ulong)bVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_allocated_capacity != &local_48) {
              operator_delete((void *)local_58._M_allocated_capacity,
                              local_48._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_p != &local_68) {
            operator_delete(local_78._M_p,
                            CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_90 + 8)) {
            operator_delete((void *)local_a0._8_8_,CONCAT71(local_90._9_7_,local_90[8]) + 1);
          }
          if (!bVar1) {
            bVar2 = (byte)paVar6;
            goto LAB_003febc1;
          }
          psVar11 = psVar11 + 1;
        } while (psVar11 != psVar7);
        psVar11 = (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = (block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (psVar11 != psVar7) {
        iVar9 = 0;
        do {
          uVar4 = GetLegacySigOpCount((psVar11->
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
          iVar9 = iVar9 + uVar4;
          psVar11 = psVar11 + 1;
        } while (psVar11 != psVar7);
        if (80000 < (uint)(iVar9 * 4)) {
          local_a0._0_8_ = local_90;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"bad-blk-sigops","");
          local_58._M_allocated_capacity = (size_type)&local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"out-of-bounds SigOpCount","");
          bVar2 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                             (string *)local_a0,(string *)&local_58);
          goto LAB_003feb88;
        }
      }
      if (fCheckPOW && fCheckMerkleRoot) {
        block->fChecked = true;
      }
      goto LAB_003febc1;
    }
    local_a0._0_8_ = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"bad-cb-missing","");
    local_58._M_allocated_capacity = (size_type)&local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"first tx is not coinbase","");
    bVar2 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                       (string *)local_a0,(string *)&local_58);
  }
  else {
LAB_003fe721:
    local_a0._0_8_ = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"bad-blk-length","");
    local_58._M_allocated_capacity = (size_type)&local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"size limits failed","");
    bVar2 = ValidationState<BlockValidationResult>::Invalid
                      (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                       (string *)local_a0,(string *)&local_58);
  }
LAB_003feb88:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
  }
  if ((TransactionSerParams *)local_a0._0_8_ != (TransactionSerParams *)local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
  }
LAB_003febc1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool CheckBlock(const CBlock& block, BlockValidationState& state, const Consensus::Params& consensusParams, bool fCheckPOW, bool fCheckMerkleRoot)
{
    // These are checks that are independent of context.

    if (block.fChecked)
        return true;

    // Check that the header is valid (particularly PoW).  This is mostly
    // redundant with the call in AcceptBlockHeader.
    if (!CheckBlockHeader(block, state, consensusParams, fCheckPOW))
        return false;

    // Signet only: check block solution
    if (consensusParams.signet_blocks && fCheckPOW && !CheckSignetBlockSolution(block, consensusParams)) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-signet-blksig", "signet block signature validation failure");
    }

    // Check the merkle root.
    if (fCheckMerkleRoot && !CheckMerkleRoot(block, state)) {
        return false;
    }

    // All potential-corruption validation must be done before we do any
    // transaction validation, as otherwise we may mark the header as invalid
    // because we receive the wrong transactions for it.
    // Note that witness malleability is checked in ContextualCheckBlock, so no
    // checks that use witness data may be performed here.

    // Size limits
    if (block.vtx.empty() || block.vtx.size() * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT || ::GetSerializeSize(TX_NO_WITNESS(block)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT)
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-length", "size limits failed");

    // First transaction must be coinbase, the rest must not be
    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase())
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-missing", "first tx is not coinbase");
    for (unsigned int i = 1; i < block.vtx.size(); i++)
        if (block.vtx[i]->IsCoinBase())
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-multiple", "more than one coinbase");

    // Check transactions
    // Must check for duplicate inputs (see CVE-2018-17144)
    for (const auto& tx : block.vtx) {
        TxValidationState tx_state;
        if (!CheckTransaction(*tx, tx_state)) {
            // CheckBlock() does context-free validation checks. The only
            // possible failures are consensus failures.
            assert(tx_state.GetResult() == TxValidationResult::TX_CONSENSUS);
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, tx_state.GetRejectReason(),
                                 strprintf("Transaction check failed (tx hash %s) %s", tx->GetHash().ToString(), tx_state.GetDebugMessage()));
        }
    }
    unsigned int nSigOps = 0;
    for (const auto& tx : block.vtx)
    {
        nSigOps += GetLegacySigOpCount(*tx);
    }
    if (nSigOps * WITNESS_SCALE_FACTOR > MAX_BLOCK_SIGOPS_COST)
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops", "out-of-bounds SigOpCount");

    if (fCheckPOW && fCheckMerkleRoot)
        block.fChecked = true;

    return true;
}